

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O0

void Eigen::internal::general_matrix_vector_product<long,_double,_1,_false,_double,_false,_0>::run
               (long rows,long cols,double *lhs,long lhsStride,double *rhs,long rhsIncr,
               ResScalar *res,long resIncr,ResScalar alpha)

{
  double dVar1;
  int iVar2;
  int iVar3;
  ResScalar *pRVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dc_22;
  undefined4 extraout_XMM0_Dc_23;
  undefined4 extraout_XMM0_Dc_24;
  undefined4 extraout_XMM0_Dc_25;
  undefined4 extraout_XMM0_Dc_26;
  undefined4 extraout_XMM0_Dc_27;
  undefined4 extraout_XMM0_Dc_28;
  undefined4 extraout_XMM0_Dc_29;
  undefined4 extraout_XMM0_Dc_30;
  undefined4 extraout_XMM0_Dc_31;
  undefined4 extraout_XMM0_Dc_32;
  undefined4 extraout_XMM0_Dc_33;
  undefined4 extraout_XMM0_Dc_34;
  undefined4 extraout_XMM0_Dc_35;
  undefined4 extraout_XMM0_Dc_36;
  undefined4 extraout_XMM0_Dc_37;
  undefined4 extraout_XMM0_Dc_38;
  undefined4 extraout_XMM0_Dc_39;
  undefined4 extraout_XMM0_Dc_40;
  undefined4 extraout_XMM0_Dc_41;
  undefined4 extraout_XMM0_Dc_42;
  undefined4 extraout_XMM0_Dc_43;
  undefined4 extraout_XMM0_Dc_44;
  undefined4 extraout_XMM0_Dc_45;
  undefined4 extraout_XMM0_Dc_46;
  undefined4 extraout_XMM0_Dc_47;
  undefined4 extraout_XMM0_Dc_48;
  undefined4 extraout_XMM0_Dc_49;
  undefined4 extraout_XMM0_Dc_50;
  undefined4 extraout_XMM0_Dc_51;
  undefined4 extraout_XMM0_Dc_52;
  undefined4 extraout_XMM0_Dc_53;
  undefined4 extraout_XMM0_Dc_54;
  undefined4 extraout_XMM0_Dc_55;
  undefined4 extraout_XMM0_Dc_56;
  undefined4 extraout_XMM0_Dc_57;
  undefined4 extraout_XMM0_Dc_58;
  undefined4 extraout_XMM0_Dc_59;
  undefined4 extraout_XMM0_Dc_60;
  undefined4 extraout_XMM0_Dc_61;
  undefined4 extraout_XMM0_Dc_62;
  undefined4 extraout_XMM0_Dc_63;
  undefined4 extraout_XMM0_Dc_64;
  undefined4 extraout_XMM0_Dc_65;
  undefined4 extraout_XMM0_Dc_66;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined4 extraout_XMM0_Dd_20;
  undefined4 extraout_XMM0_Dd_21;
  undefined4 extraout_XMM0_Dd_22;
  undefined4 extraout_XMM0_Dd_23;
  undefined4 extraout_XMM0_Dd_24;
  undefined4 extraout_XMM0_Dd_25;
  undefined4 extraout_XMM0_Dd_26;
  undefined4 extraout_XMM0_Dd_27;
  undefined4 extraout_XMM0_Dd_28;
  undefined4 extraout_XMM0_Dd_29;
  undefined4 extraout_XMM0_Dd_30;
  undefined4 extraout_XMM0_Dd_31;
  undefined4 extraout_XMM0_Dd_32;
  undefined4 extraout_XMM0_Dd_33;
  undefined4 extraout_XMM0_Dd_34;
  undefined4 extraout_XMM0_Dd_35;
  undefined4 extraout_XMM0_Dd_36;
  undefined4 extraout_XMM0_Dd_37;
  undefined4 extraout_XMM0_Dd_38;
  undefined4 extraout_XMM0_Dd_39;
  undefined4 extraout_XMM0_Dd_40;
  undefined4 extraout_XMM0_Dd_41;
  undefined4 extraout_XMM0_Dd_42;
  undefined4 extraout_XMM0_Dd_43;
  undefined4 extraout_XMM0_Dd_44;
  undefined4 extraout_XMM0_Dd_45;
  undefined4 extraout_XMM0_Dd_46;
  undefined4 extraout_XMM0_Dd_47;
  undefined4 extraout_XMM0_Dd_48;
  undefined4 extraout_XMM0_Dd_49;
  undefined4 extraout_XMM0_Dd_50;
  undefined4 extraout_XMM0_Dd_51;
  undefined4 extraout_XMM0_Dd_52;
  undefined4 extraout_XMM0_Dd_53;
  undefined4 extraout_XMM0_Dd_54;
  undefined4 extraout_XMM0_Dd_55;
  undefined4 extraout_XMM0_Dd_56;
  undefined4 extraout_XMM0_Dd_57;
  undefined4 extraout_XMM0_Dd_58;
  undefined4 extraout_XMM0_Dd_59;
  undefined4 extraout_XMM0_Dd_60;
  undefined4 extraout_XMM0_Dd_61;
  undefined4 extraout_XMM0_Dd_62;
  undefined4 extraout_XMM0_Dd_63;
  undefined4 extraout_XMM0_Dd_64;
  undefined4 extraout_XMM0_Dd_65;
  undefined4 extraout_XMM0_Dd_66;
  Packet2d adVar9;
  double adVar10 [2];
  uint local_464;
  long local_460;
  long j_9;
  double local_448 [2];
  long local_430;
  long j_8;
  double local_418 [2];
  long local_400;
  long j_7;
  long j_6;
  double *lhs0_1;
  ResPacket ptmp0_1;
  ResScalar tmp0_1;
  long i_1;
  long start;
  long end;
  double b_6;
  long j_5;
  double local_398 [2];
  double local_388 [2];
  double local_378 [2];
  undefined1 auStack_368 [8];
  RhsPacket b_5;
  long local_350;
  long j_4;
  double local_338 [2];
  double local_328 [2];
  double local_318 [2];
  undefined1 auStack_308 [8];
  RhsPacket b_4;
  double local_2e8 [2];
  undefined1 auStack_2d8 [8];
  RhsPacket b_3;
  LhsPacket A13;
  LhsPacket A12;
  LhsPacket A11;
  LhsPacket A03;
  LhsPacket A02;
  LhsPacket A01;
  long local_260;
  long j_3;
  double local_248 [2];
  double local_238 [2];
  double local_228 [2];
  undefined1 auStack_218 [8];
  RhsPacket b_2;
  long local_200;
  long j_2;
  double local_1e8 [2];
  double local_1d8 [2];
  double local_1c8 [2];
  undefined1 auStack_1b8 [8];
  RhsPacket b_1;
  long j_1;
  double b;
  long j;
  undefined1 auStack_188 [8];
  ResPacket ptmp3;
  double local_170;
  undefined1 auStack_168 [8];
  ResPacket ptmp2;
  double local_150;
  undefined1 auStack_148 [8];
  ResPacket ptmp1;
  double local_130;
  undefined1 auStack_128 [8];
  ResPacket ptmp0;
  double *lhs3;
  double *lhs2;
  double *lhs1;
  double *lhs0;
  ResScalar tmp3;
  ResScalar tmp2;
  ResScalar tmp1;
  ResScalar tmp0;
  long i;
  long rowBound;
  long offset3;
  long offset1;
  ResScalar local_a8;
  long skipRows;
  long lhsAlignmentOffset;
  long alignmentPattern;
  long alignmentStep;
  long peeledSize;
  long alignedSize;
  long alignedStart;
  long depth;
  long LhsPacketAlignedMask;
  long RhsPacketAlignedMask;
  long peels;
  long rowsAtOnce;
  conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
  pcj;
  ResScalar RStack_40;
  conj_helper<double,_double,_false,_false> cj;
  ResScalar alpha_local;
  long rhsIncr_local;
  double *rhs_local;
  long lhsStride_local;
  double *lhs_local;
  long cols_local;
  long rows_local;
  
  RStack_40 = alpha;
  alpha_local = (ResScalar)rhsIncr;
  rhsIncr_local = (long)rhs;
  rhs_local = (double *)lhsStride;
  lhsStride_local = (long)lhs;
  lhs_local = (double *)cols;
  cols_local = rows;
  ignore_unused_variable<long>((long *)&alpha_local);
  peels = 4;
  RhsPacketAlignedMask = 2;
  LhsPacketAlignedMask = 1;
  depth = 1;
  alignedStart = (long)lhs_local;
  alignedSize = first_aligned<double,long>((double *)rhsIncr_local,(long)lhs_local);
  peeledSize = alignedSize + (alignedStart - alignedSize & 0xfffffffffffffffeU);
  alignmentStep = peeledSize + -5;
  alignmentPattern = 2U - (long)rhs_local % 2 & 1;
  if (alignmentPattern == 0) {
    local_464 = 0;
  }
  else {
    local_464 = 2;
    if (alignmentPattern == 1) {
      local_464 = 1;
    }
  }
  lhsAlignmentOffset = (long)local_464;
  skipRows = first_aligned<double,long>((double *)lhsStride_local,alignedStart);
  local_a8 = 0.0;
  if (((lhsStride_local & 7U) == 0) && ((rhsIncr_local & 7U) == 0)) {
    for (; (long)local_a8 < 2 && alignedSize != (skipRows + alignmentPattern * (long)local_a8) % 2;
        local_a8 = (ResScalar)((long)local_a8 + 1)) {
    }
    if (local_a8 == 9.88131291682493e-324) {
      lhsAlignmentOffset = 3;
      local_a8 = 0.0;
    }
    else {
      offset1 = cols_local;
      pRVar4 = (ResScalar *)std::min<long>((long *)&local_a8,&offset1);
      local_a8 = *pRVar4;
    }
  }
  else {
    peeledSize = 0;
    alignedSize = 0;
  }
  iVar2 = 1;
  if (alignmentPattern == 1) {
    iVar2 = 3;
  }
  iVar3 = 3;
  if (alignmentPattern == 1) {
    iVar3 = 1;
  }
  i_1 = ((cols_local - (long)local_a8) / 4) * 4 + (long)local_a8;
  for (tmp0 = local_a8; (long)tmp0 < i_1; tmp0 = (ResScalar)((long)tmp0 + 4)) {
    tmp1 = 0.0;
    tmp2 = 0.0;
    tmp3 = 0.0;
    lhs0 = (double *)0x0;
    lVar5 = lhsStride_local + (long)tmp0 * (long)rhs_local * 8;
    lVar6 = lhsStride_local + ((long)tmp0 + (long)iVar2) * (long)rhs_local * 8;
    lVar7 = lhsStride_local + ((long)tmp0 + 2) * (long)rhs_local * 8;
    lVar8 = lhsStride_local + ((long)tmp0 + (long)iVar3) * (long)rhs_local * 8;
    local_130 = 0.0;
    adVar9 = pset1<double__vector(2)>(&local_130);
    unique0x10000515 = extraout_XMM0_Dc;
    auStack_128 = adVar9[0];
    unique0x10000519 = extraout_XMM0_Dd;
    local_150 = 0.0;
    adVar9 = pset1<double__vector(2)>(&local_150);
    unique0x10000539 = extraout_XMM0_Dc_00;
    auStack_148 = adVar9[0];
    unique0x1000053d = extraout_XMM0_Dd_00;
    local_170 = 0.0;
    adVar9 = pset1<double__vector(2)>(&local_170);
    unique0x1000055d = extraout_XMM0_Dc_01;
    auStack_168 = adVar9[0];
    unique0x10000561 = extraout_XMM0_Dd_01;
    j = 0;
    adVar9 = pset1<double__vector(2)>((double *)&j);
    unique0x10000581 = extraout_XMM0_Dc_02;
    auStack_188 = adVar9[0];
    unique0x10000585 = extraout_XMM0_Dd_02;
    for (b = 0.0; (long)b < alignedSize; b = (double)((long)b + 1)) {
      j_1 = *(long *)(rhsIncr_local + (long)b * 8);
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         (double *)(lVar5 + (long)b * 8),(double *)&j_1);
      tmp1 = dVar1 + tmp1;
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         (double *)(lVar6 + (long)b * 8),(double *)&j_1);
      tmp2 = dVar1 + tmp2;
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         (double *)(lVar7 + (long)b * 8),(double *)&j_1);
      tmp3 = dVar1 + tmp3;
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         (double *)(lVar8 + (long)b * 8),(double *)&j_1);
      lhs0 = (double *)(dVar1 + (double)lhs0);
    }
    if (alignedSize < peeledSize) {
      if (lhsAlignmentOffset == 0) {
        for (b_1[1] = (double)alignedSize; (long)b_1[1] < peeledSize;
            b_1[1] = (double)((long)b_1[1] + 2)) {
          adVar9 = pload<double__vector(2)>((double *)(rhsIncr_local + (long)b_1[1] * 8));
          unique0x10000c65 = extraout_XMM0_Dc_03;
          auStack_1b8 = adVar9[0];
          unique0x10000c69 = extraout_XMM0_Dd_03;
          adVar9 = pload<double__vector(2)>((double *)(lVar5 + (long)b_1[1] * 8));
          local_1c8[1]._0_4_ = extraout_XMM0_Dc_04;
          local_1c8[0] = adVar9[0];
          local_1c8[1]._4_4_ = extraout_XMM0_Dd_04;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),&local_1c8,(double (*) [2])auStack_1b8,
                            (double (*) [2])auStack_128);
          unique0x10000cad = extraout_XMM0_Dc_05;
          auStack_128 = adVar10[0];
          unique0x10000cb1 = extraout_XMM0_Dd_05;
          adVar9 = pload<double__vector(2)>((double *)(lVar6 + (long)b_1[1] * 8));
          local_1d8[1]._0_4_ = extraout_XMM0_Dc_06;
          local_1d8[0] = adVar9[0];
          local_1d8[1]._4_4_ = extraout_XMM0_Dd_06;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),&local_1d8,(double (*) [2])auStack_1b8,
                            (double (*) [2])auStack_148);
          unique0x10000cf5 = extraout_XMM0_Dc_07;
          auStack_148 = adVar10[0];
          unique0x10000cf9 = extraout_XMM0_Dd_07;
          adVar9 = pload<double__vector(2)>((double *)(lVar7 + (long)b_1[1] * 8));
          local_1e8[1]._0_4_ = extraout_XMM0_Dc_08;
          local_1e8[0] = adVar9[0];
          local_1e8[1]._4_4_ = extraout_XMM0_Dd_08;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),&local_1e8,(double (*) [2])auStack_1b8,
                            (double (*) [2])auStack_168);
          unique0x10000d3d = extraout_XMM0_Dc_09;
          auStack_168 = adVar10[0];
          unique0x10000d41 = extraout_XMM0_Dd_09;
          adVar9 = pload<double__vector(2)>((double *)(lVar8 + (long)b_1[1] * 8));
          unique0x10000d61 = extraout_XMM0_Dc_10;
          j_2 = adVar9[0];
          unique0x10000d65 = extraout_XMM0_Dd_10;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),(double (*) [2])&j_2,
                            (double (*) [2])auStack_1b8,(double (*) [2])auStack_188);
          unique0x10000d85 = extraout_XMM0_Dc_11;
          auStack_188 = adVar10[0];
          unique0x10000d89 = extraout_XMM0_Dd_11;
        }
      }
      else if (lhsAlignmentOffset == 1) {
        for (local_200 = alignedSize; local_200 < peeledSize; local_200 = local_200 + 2) {
          adVar9 = pload<double__vector(2)>((double *)(rhsIncr_local + local_200 * 8));
          unique0x10000b21 = extraout_XMM0_Dc_12;
          auStack_218 = adVar9[0];
          unique0x10000b25 = extraout_XMM0_Dd_12;
          adVar9 = pload<double__vector(2)>((double *)(lVar5 + local_200 * 8));
          local_228[1]._0_4_ = extraout_XMM0_Dc_13;
          local_228[0] = adVar9[0];
          local_228[1]._4_4_ = extraout_XMM0_Dd_13;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),&local_228,(double (*) [2])auStack_218,
                            (double (*) [2])auStack_128);
          unique0x10000b69 = extraout_XMM0_Dc_14;
          auStack_128 = adVar10[0];
          unique0x10000b6d = extraout_XMM0_Dd_14;
          adVar9 = ploadu<double__vector(2)>((double *)(lVar6 + local_200 * 8));
          local_238[1]._0_4_ = extraout_XMM0_Dc_15;
          local_238[0] = adVar9[0];
          local_238[1]._4_4_ = extraout_XMM0_Dd_15;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),&local_238,(double (*) [2])auStack_218,
                            (double (*) [2])auStack_148);
          unique0x10000bb1 = extraout_XMM0_Dc_16;
          auStack_148 = adVar10[0];
          unique0x10000bb5 = extraout_XMM0_Dd_16;
          adVar9 = pload<double__vector(2)>((double *)(lVar7 + local_200 * 8));
          local_248[1]._0_4_ = extraout_XMM0_Dc_17;
          local_248[0] = adVar9[0];
          local_248[1]._4_4_ = extraout_XMM0_Dd_17;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),&local_248,(double (*) [2])auStack_218,
                            (double (*) [2])auStack_168);
          unique0x10000bf9 = extraout_XMM0_Dc_18;
          auStack_168 = adVar10[0];
          unique0x10000bfd = extraout_XMM0_Dd_18;
          adVar9 = ploadu<double__vector(2)>((double *)(lVar8 + local_200 * 8));
          unique0x10000c1d = extraout_XMM0_Dc_19;
          j_3 = adVar9[0];
          unique0x10000c21 = extraout_XMM0_Dd_19;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),(double (*) [2])&j_3,
                            (double (*) [2])auStack_218,(double (*) [2])auStack_188);
          unique0x10000c41 = extraout_XMM0_Dc_20;
          auStack_188 = adVar10[0];
          unique0x10000c45 = extraout_XMM0_Dd_20;
        }
      }
      else if (lhsAlignmentOffset == 2) {
        local_260 = alignedSize;
        adVar9 = pload<double__vector(2)>((double *)(lVar6 + (alignedSize + -1) * 8));
        unique0x100006e9 = extraout_XMM0_Dc_21;
        A02[1] = adVar9[0];
        unique0x100006ed = extraout_XMM0_Dd_21;
        adVar9 = pload<double__vector(2)>((double *)(lVar7 + (alignedSize + -2) * 8));
        unique0x1000070d = extraout_XMM0_Dc_22;
        A03[1] = adVar9[0];
        unique0x10000711 = extraout_XMM0_Dd_22;
        adVar9 = pload<double__vector(2)>((double *)(lVar8 + (alignedSize + -3) * 8));
        unique0x10000731 = extraout_XMM0_Dc_23;
        A11[1] = adVar9[0];
        unique0x10000735 = extraout_XMM0_Dd_23;
        for (; local_260 < alignmentStep; local_260 = local_260 + 4) {
          adVar9 = pload<double__vector(2)>((double *)(rhsIncr_local + local_260 * 8));
          unique0x10000755 = extraout_XMM0_Dc_24;
          auStack_2d8 = adVar9[0];
          unique0x10000759 = extraout_XMM0_Dd_24;
          adVar9 = pload<double__vector(2)>((double *)(lVar6 + (local_260 + 1) * 8));
          unique0x10000779 = extraout_XMM0_Dc_25;
          A12[1] = adVar9[0];
          unique0x1000077d = extraout_XMM0_Dd_25;
          palign<1,double__vector(2)>((double (*) [2])(A02 + 1),(double (*) [2])(A12 + 1));
          adVar9 = pload<double__vector(2)>((double *)(lVar7 + local_260 * 8));
          unique0x1000079d = extraout_XMM0_Dc_26;
          A13[1] = adVar9[0];
          unique0x100007a1 = extraout_XMM0_Dd_26;
          palign<2,double__vector(2)>((double (*) [2])(A03 + 1),(double (*) [2])(A13 + 1));
          adVar9 = pload<double__vector(2)>((double *)(lVar8 + (local_260 + -1) * 8));
          unique0x100007c1 = extraout_XMM0_Dc_27;
          b_3[1] = adVar9[0];
          unique0x100007c5 = extraout_XMM0_Dd_27;
          palign<3,double__vector(2)>((double (*) [2])(A11 + 1),(double (*) [2])(b_3 + 1));
          adVar9 = pload<double__vector(2)>((double *)(lVar5 + local_260 * 8));
          local_2e8[1]._0_4_ = extraout_XMM0_Dc_28;
          local_2e8[0] = adVar9[0];
          local_2e8[1]._4_4_ = extraout_XMM0_Dd_28;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),&local_2e8,(double (*) [2])auStack_2d8,
                            (double (*) [2])auStack_128);
          unique0x10000809 = extraout_XMM0_Dc_29;
          auStack_128 = adVar10[0];
          unique0x1000080d = extraout_XMM0_Dd_29;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),(double (*) [2])(A02 + 1),
                            (double (*) [2])auStack_2d8,(double (*) [2])auStack_148);
          unique0x1000082d = extraout_XMM0_Dc_30;
          auStack_148 = adVar10[0];
          unique0x10000831 = extraout_XMM0_Dd_30;
          adVar9 = pload<double__vector(2)>((double *)(lVar6 + (local_260 + 3) * 8));
          unique0x10000851 = extraout_XMM0_Dc_31;
          A02[1] = adVar9[0];
          unique0x10000855 = extraout_XMM0_Dd_31;
          palign<1,double__vector(2)>((double (*) [2])(A12 + 1),(double (*) [2])(A02 + 1));
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),(double (*) [2])(A03 + 1),
                            (double (*) [2])auStack_2d8,(double (*) [2])auStack_168);
          unique0x10000875 = extraout_XMM0_Dc_32;
          auStack_168 = adVar10[0];
          unique0x10000879 = extraout_XMM0_Dd_32;
          adVar9 = pload<double__vector(2)>((double *)(lVar7 + (local_260 + 2) * 8));
          unique0x10000899 = extraout_XMM0_Dc_33;
          A03[1] = adVar9[0];
          unique0x1000089d = extraout_XMM0_Dd_33;
          palign<2,double__vector(2)>((double (*) [2])(A13 + 1),(double (*) [2])(A03 + 1));
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),(double (*) [2])(A11 + 1),
                            (double (*) [2])auStack_2d8,(double (*) [2])auStack_188);
          unique0x100008bd = extraout_XMM0_Dc_34;
          auStack_188 = adVar10[0];
          unique0x100008c1 = extraout_XMM0_Dd_34;
          adVar9 = pload<double__vector(2)>((double *)(lVar8 + (local_260 + 1) * 8));
          unique0x100008e1 = extraout_XMM0_Dc_35;
          A11[1] = adVar9[0];
          unique0x100008e5 = extraout_XMM0_Dd_35;
          palign<3,double__vector(2)>((double (*) [2])(b_3 + 1),(double (*) [2])(A11 + 1));
          adVar9 = pload<double__vector(2)>((double *)(rhsIncr_local + (local_260 + 2) * 8));
          unique0x10000905 = extraout_XMM0_Dc_36;
          auStack_2d8 = adVar9[0];
          unique0x10000909 = extraout_XMM0_Dd_36;
          adVar9 = pload<double__vector(2)>((double *)(lVar5 + (local_260 + 2) * 8));
          unique0x10000929 = extraout_XMM0_Dc_37;
          b_4[1] = adVar9[0];
          unique0x1000092d = extraout_XMM0_Dd_37;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),(double (*) [2])(b_4 + 1),
                            (double (*) [2])auStack_2d8,(double (*) [2])auStack_128);
          unique0x1000094d = extraout_XMM0_Dc_38;
          auStack_128 = adVar10[0];
          unique0x10000951 = extraout_XMM0_Dd_38;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),(double (*) [2])(A12 + 1),
                            (double (*) [2])auStack_2d8,(double (*) [2])auStack_148);
          unique0x10000971 = extraout_XMM0_Dc_39;
          auStack_148 = adVar10[0];
          unique0x10000975 = extraout_XMM0_Dd_39;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),(double (*) [2])(A13 + 1),
                            (double (*) [2])auStack_2d8,(double (*) [2])auStack_168);
          unique0x10000995 = extraout_XMM0_Dc_40;
          auStack_168 = adVar10[0];
          unique0x10000999 = extraout_XMM0_Dd_40;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),(double (*) [2])(b_3 + 1),
                            (double (*) [2])auStack_2d8,(double (*) [2])auStack_188);
          unique0x100009b9 = extraout_XMM0_Dc_41;
          auStack_188 = adVar10[0];
          unique0x100009bd = extraout_XMM0_Dd_41;
        }
        for (; local_260 < peeledSize; local_260 = local_260 + 2) {
          adVar9 = pload<double__vector(2)>((double *)(rhsIncr_local + local_260 * 8));
          unique0x100009dd = extraout_XMM0_Dc_42;
          auStack_308 = adVar9[0];
          unique0x100009e1 = extraout_XMM0_Dd_42;
          adVar9 = pload<double__vector(2)>((double *)(lVar5 + local_260 * 8));
          local_318[1]._0_4_ = extraout_XMM0_Dc_43;
          local_318[0] = adVar9[0];
          local_318[1]._4_4_ = extraout_XMM0_Dd_43;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),&local_318,(double (*) [2])auStack_308,
                            (double (*) [2])auStack_128);
          unique0x10000a25 = extraout_XMM0_Dc_44;
          auStack_128 = adVar10[0];
          unique0x10000a29 = extraout_XMM0_Dd_44;
          adVar9 = ploadu<double__vector(2)>((double *)(lVar6 + local_260 * 8));
          local_328[1]._0_4_ = extraout_XMM0_Dc_45;
          local_328[0] = adVar9[0];
          local_328[1]._4_4_ = extraout_XMM0_Dd_45;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),&local_328,(double (*) [2])auStack_308,
                            (double (*) [2])auStack_148);
          unique0x10000a6d = extraout_XMM0_Dc_46;
          auStack_148 = adVar10[0];
          unique0x10000a71 = extraout_XMM0_Dd_46;
          adVar9 = ploadu<double__vector(2)>((double *)(lVar7 + local_260 * 8));
          local_338[1]._0_4_ = extraout_XMM0_Dc_47;
          local_338[0] = adVar9[0];
          local_338[1]._4_4_ = extraout_XMM0_Dd_47;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),&local_338,(double (*) [2])auStack_308,
                            (double (*) [2])auStack_168);
          unique0x10000ab5 = extraout_XMM0_Dc_48;
          auStack_168 = adVar10[0];
          unique0x10000ab9 = extraout_XMM0_Dd_48;
          adVar9 = ploadu<double__vector(2)>((double *)(lVar8 + local_260 * 8));
          unique0x10000ad9 = extraout_XMM0_Dc_49;
          j_4 = adVar9[0];
          unique0x10000add = extraout_XMM0_Dd_49;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),(double (*) [2])&j_4,
                            (double (*) [2])auStack_308,(double (*) [2])auStack_188);
          unique0x10000afd = extraout_XMM0_Dc_50;
          auStack_188 = adVar10[0];
          unique0x10000b01 = extraout_XMM0_Dd_50;
        }
      }
      else {
        for (local_350 = alignedSize; local_350 < peeledSize; local_350 = local_350 + 2) {
          adVar9 = pload<double__vector(2)>((double *)(rhsIncr_local + local_350 * 8));
          unique0x100005a5 = extraout_XMM0_Dc_51;
          auStack_368 = adVar9[0];
          unique0x100005a9 = extraout_XMM0_Dd_51;
          adVar9 = ploadu<double__vector(2)>((double *)(lVar5 + local_350 * 8));
          local_378[1]._0_4_ = extraout_XMM0_Dc_52;
          local_378[0] = adVar9[0];
          local_378[1]._4_4_ = extraout_XMM0_Dd_52;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),&local_378,(double (*) [2])auStack_368,
                            (double (*) [2])auStack_128);
          unique0x100005ed = extraout_XMM0_Dc_53;
          auStack_128 = adVar10[0];
          unique0x100005f1 = extraout_XMM0_Dd_53;
          adVar9 = ploadu<double__vector(2)>((double *)(lVar6 + local_350 * 8));
          local_388[1]._0_4_ = extraout_XMM0_Dc_54;
          local_388[0] = adVar9[0];
          local_388[1]._4_4_ = extraout_XMM0_Dd_54;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),&local_388,(double (*) [2])auStack_368,
                            (double (*) [2])auStack_148);
          unique0x10000635 = extraout_XMM0_Dc_55;
          auStack_148 = adVar10[0];
          unique0x10000639 = extraout_XMM0_Dd_55;
          adVar9 = ploadu<double__vector(2)>((double *)(lVar7 + local_350 * 8));
          local_398[1]._0_4_ = extraout_XMM0_Dc_56;
          local_398[0] = adVar9[0];
          local_398[1]._4_4_ = extraout_XMM0_Dd_56;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),&local_398,(double (*) [2])auStack_368,
                            (double (*) [2])auStack_168);
          unique0x1000067d = extraout_XMM0_Dc_57;
          auStack_168 = adVar10[0];
          unique0x10000681 = extraout_XMM0_Dd_57;
          adVar9 = ploadu<double__vector(2)>((double *)(lVar8 + local_350 * 8));
          unique0x100006a1 = extraout_XMM0_Dc_58;
          j_5 = adVar9[0];
          unique0x100006a5 = extraout_XMM0_Dd_58;
          adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                             *)((long)&rowsAtOnce + 6),(double (*) [2])&j_5,
                            (double (*) [2])auStack_368,(double (*) [2])auStack_188);
          unique0x100006c5 = extraout_XMM0_Dc_59;
          auStack_188 = adVar10[0];
          unique0x100006c9 = extraout_XMM0_Dd_59;
        }
      }
      dVar1 = predux<double__vector(2)>((Packet2d *)auStack_128);
      tmp1 = dVar1 + tmp1;
      dVar1 = predux<double__vector(2)>((Packet2d *)auStack_148);
      tmp2 = dVar1 + tmp2;
      dVar1 = predux<double__vector(2)>((Packet2d *)auStack_168);
      tmp3 = dVar1 + tmp3;
      dVar1 = predux<double__vector(2)>((Packet2d *)auStack_188);
      lhs0 = (double *)(dVar1 + (double)lhs0);
    }
    for (b_6 = (double)peeledSize; (long)b_6 < alignedStart; b_6 = (double)((long)b_6 + 1)) {
      end = *(long *)(rhsIncr_local + (long)b_6 * 8);
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         (double *)(lVar5 + (long)b_6 * 8),(double *)&end);
      tmp1 = dVar1 + tmp1;
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         (double *)(lVar6 + (long)b_6 * 8),(double *)&end);
      tmp2 = dVar1 + tmp2;
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         (double *)(lVar7 + (long)b_6 * 8),(double *)&end);
      tmp3 = dVar1 + tmp3;
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         (double *)(lVar8 + (long)b_6 * 8),(double *)&end);
      lhs0 = (double *)(dVar1 + (double)lhs0);
    }
    res[(long)tmp0 * resIncr] = RStack_40 * tmp1 + res[(long)tmp0 * resIncr];
    lVar5 = ((long)tmp0 + (long)iVar2) * resIncr;
    res[lVar5] = RStack_40 * tmp2 + res[lVar5];
    lVar5 = ((long)tmp0 + 2) * resIncr;
    res[lVar5] = RStack_40 * tmp3 + res[lVar5];
    lVar5 = ((long)tmp0 + (long)iVar3) * resIncr;
    res[lVar5] = RStack_40 * (double)lhs0 + res[lVar5];
  }
  start = cols_local;
  while( true ) {
    for (tmp0_1 = (ResScalar)i_1; (long)tmp0_1 < start; tmp0_1 = (ResScalar)((long)tmp0_1 + 1)) {
      ptmp0_1[1] = 0.0;
      adVar9 = pset1<double__vector(2)>(ptmp0_1 + 1);
      unique0x10000da9 = extraout_XMM0_Dc_60;
      lhs0_1 = adVar9[0];
      unique0x10000dad = extraout_XMM0_Dd_60;
      j_6 = lhsStride_local + (long)tmp0_1 * (long)rhs_local * 8;
      for (j_7 = 0; j_7 < alignedSize; j_7 = j_7 + 1) {
        dVar1 = conj_helper<double,_double,_false,_false>::pmul
                          ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                           (double *)(j_6 + j_7 * 8),(double *)(rhsIncr_local + j_7 * 8));
        ptmp0_1[1] = dVar1 + ptmp0_1[1];
      }
      if (alignedSize < peeledSize) {
        if ((j_6 + alignedSize * 8 & 0xfU) == 0) {
          for (local_400 = alignedSize; local_400 < peeledSize; local_400 = local_400 + 2) {
            adVar9 = pload<double__vector(2)>((double *)(j_6 + local_400 * 8));
            local_418[1]._0_4_ = extraout_XMM0_Dc_61;
            local_418[0] = adVar9[0];
            local_418[1]._4_4_ = extraout_XMM0_Dd_61;
            adVar9 = pload<double__vector(2)>((double *)(rhsIncr_local + local_400 * 8));
            unique0x10000df1 = extraout_XMM0_Dc_62;
            j_8 = adVar9[0];
            unique0x10000df5 = extraout_XMM0_Dd_62;
            adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                      ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                               *)((long)&rowsAtOnce + 6),&local_418,(double (*) [2])&j_8,
                              (double (*) [2])&lhs0_1);
            unique0x10000e15 = extraout_XMM0_Dc_63;
            lhs0_1 = adVar10[0];
            unique0x10000e19 = extraout_XMM0_Dd_63;
          }
        }
        else {
          for (local_430 = alignedSize; local_430 < peeledSize; local_430 = local_430 + 2) {
            adVar9 = ploadu<double__vector(2)>((double *)(j_6 + local_430 * 8));
            local_448[1]._0_4_ = extraout_XMM0_Dc_64;
            local_448[0] = adVar9[0];
            local_448[1]._4_4_ = extraout_XMM0_Dd_64;
            adVar9 = pload<double__vector(2)>((double *)(rhsIncr_local + local_430 * 8));
            unique0x10000e5d = extraout_XMM0_Dc_65;
            j_9 = adVar9[0];
            unique0x10000e61 = extraout_XMM0_Dd_65;
            adVar10 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                      ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                               *)((long)&rowsAtOnce + 6),&local_448,(double (*) [2])&j_9,
                              (double (*) [2])&lhs0_1);
            unique0x10000e81 = extraout_XMM0_Dc_66;
            lhs0_1 = adVar10[0];
            unique0x10000e85 = extraout_XMM0_Dd_66;
          }
        }
        dVar1 = predux<double__vector(2)>((Packet2d *)&lhs0_1);
        ptmp0_1[1] = dVar1 + ptmp0_1[1];
      }
      for (local_460 = peeledSize; local_460 < alignedStart; local_460 = local_460 + 1) {
        dVar1 = conj_helper<double,_double,_false,_false>::pmul
                          ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                           (double *)(j_6 + local_460 * 8),(double *)(rhsIncr_local + local_460 * 8)
                          );
        ptmp0_1[1] = dVar1 + ptmp0_1[1];
      }
      res[(long)tmp0_1 * resIncr] = RStack_40 * ptmp0_1[1] + res[(long)tmp0_1 * resIncr];
    }
    if (local_a8 == 0.0) break;
    i_1 = 0;
    start = (long)local_a8;
    local_a8 = 0.0;
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,RowMajor,ConjugateLhs,RhsScalar,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsScalar* lhs, Index lhsStride,
  const RhsScalar* rhs, Index rhsIncr,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(rhsIncr);
  eigen_internal_assert(rhsIncr==1);
  #ifdef _EIGEN_ACCUMULATE_PACKETS
  #error _EIGEN_ACCUMULATE_PACKETS has already been defined
  #endif

  #define _EIGEN_ACCUMULATE_PACKETS(A0,A13,A2) {\
    RhsPacket b = pload<RhsPacket>(&rhs[j]); \
    ptmp0 = pcj.pmadd(EIGEN_CAT(ploa,A0) <LhsPacket>(&lhs0[j]), b, ptmp0); \
    ptmp1 = pcj.pmadd(EIGEN_CAT(ploa,A13)<LhsPacket>(&lhs1[j]), b, ptmp1); \
    ptmp2 = pcj.pmadd(EIGEN_CAT(ploa,A2) <LhsPacket>(&lhs2[j]), b, ptmp2); \
    ptmp3 = pcj.pmadd(EIGEN_CAT(ploa,A13)<LhsPacket>(&lhs3[j]), b, ptmp3); }

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;

  enum { AllAligned=0, EvenAligned=1, FirstAligned=2, NoneAligned=3 };
  const Index rowsAtOnce = 4;
  const Index peels = 2;
  const Index RhsPacketAlignedMask = RhsPacketSize-1;
  const Index LhsPacketAlignedMask = LhsPacketSize-1;
//   const Index PeelAlignedMask = RhsPacketSize*peels-1;
  const Index depth = cols;

  // How many coeffs of the result do we have to skip to be aligned.
  // Here we assume data are at least aligned on the base scalar type
  // if that's not the case then vectorization is discarded, see below.
  Index alignedStart = internal::first_aligned(rhs, depth);
  Index alignedSize = RhsPacketSize>1 ? alignedStart + ((depth-alignedStart) & ~RhsPacketAlignedMask) : 0;
  const Index peeledSize = alignedSize - RhsPacketSize*peels - RhsPacketSize + 1;

  const Index alignmentStep = LhsPacketSize>1 ? (LhsPacketSize - lhsStride % LhsPacketSize) & LhsPacketAlignedMask : 0;
  Index alignmentPattern = alignmentStep==0 ? AllAligned
                         : alignmentStep==(LhsPacketSize/2) ? EvenAligned
                         : FirstAligned;

  // we cannot assume the first element is aligned because of sub-matrices
  const Index lhsAlignmentOffset = internal::first_aligned(lhs,depth);

  // find how many rows do we have to skip to be aligned with rhs (if possible)
  Index skipRows = 0;
  // if the data cannot be aligned (TODO add some compile time tests when possible, e.g. for floats)
  if( (sizeof(LhsScalar)!=sizeof(RhsScalar)) || (size_t(lhs)%sizeof(LhsScalar)) || (size_t(rhs)%sizeof(RhsScalar)) )
  {
    alignedSize = 0;
    alignedStart = 0;
  }
  else if (LhsPacketSize>1)
  {
    eigen_internal_assert(size_t(lhs+lhsAlignmentOffset)%sizeof(LhsPacket)==0  || depth<LhsPacketSize);

    while (skipRows<LhsPacketSize &&
           alignedStart != ((lhsAlignmentOffset + alignmentStep*skipRows)%LhsPacketSize))
      ++skipRows;
    if (skipRows==LhsPacketSize)
    {
      // nothing can be aligned, no need to skip any column
      alignmentPattern = NoneAligned;
      skipRows = 0;
    }
    else
    {
      skipRows = (std::min)(skipRows,Index(rows));
      // note that the skiped columns are processed later.
    }
    eigen_internal_assert(  alignmentPattern==NoneAligned
                      || LhsPacketSize==1
                      || (skipRows + rowsAtOnce >= rows)
                      || LhsPacketSize > depth
                      || (size_t(lhs+alignedStart+lhsStride*skipRows)%sizeof(LhsPacket))==0);
  }
  else if(Vectorizable)
  {
    alignedStart = 0;
    alignedSize = depth;
    alignmentPattern = AllAligned;
  }

  Index offset1 = (FirstAligned && alignmentStep==1?3:1);
  Index offset3 = (FirstAligned && alignmentStep==1?1:3);

  Index rowBound = ((rows-skipRows)/rowsAtOnce)*rowsAtOnce + skipRows;
  for (Index i=skipRows; i<rowBound; i+=rowsAtOnce)
  {
    EIGEN_ALIGN16 ResScalar tmp0 = ResScalar(0);
    ResScalar tmp1 = ResScalar(0), tmp2 = ResScalar(0), tmp3 = ResScalar(0);

    // this helps the compiler generating good binary code
    const LhsScalar *lhs0 = lhs + i*lhsStride,     *lhs1 = lhs + (i+offset1)*lhsStride,
                    *lhs2 = lhs + (i+2)*lhsStride, *lhs3 = lhs + (i+offset3)*lhsStride;

    if (Vectorizable)
    {
      /* explicit vectorization */
      ResPacket ptmp0 = pset1<ResPacket>(ResScalar(0)), ptmp1 = pset1<ResPacket>(ResScalar(0)),
                ptmp2 = pset1<ResPacket>(ResScalar(0)), ptmp3 = pset1<ResPacket>(ResScalar(0));

      // process initial unaligned coeffs
      // FIXME this loop get vectorized by the compiler !
      for (Index j=0; j<alignedStart; ++j)
      {
        RhsScalar b = rhs[j];
        tmp0 += cj.pmul(lhs0[j],b); tmp1 += cj.pmul(lhs1[j],b);
        tmp2 += cj.pmul(lhs2[j],b); tmp3 += cj.pmul(lhs3[j],b);
      }

      if (alignedSize>alignedStart)
      {
        switch(alignmentPattern)
        {
          case AllAligned:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,d,d);
            break;
          case EvenAligned:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,d);
            break;
          case FirstAligned:
          {
            Index j = alignedStart;
            if (peels>1)
            {
              /* Here we proccess 4 rows with with two peeled iterations to hide
               * the overhead of unaligned loads. Moreover unaligned loads are handled
               * using special shift/move operations between the two aligned packets
               * overlaping the desired unaligned packet. This is *much* more efficient
               * than basic unaligned loads.
               */
              LhsPacket A01, A02, A03, A11, A12, A13;
              A01 = pload<LhsPacket>(&lhs1[alignedStart-1]);
              A02 = pload<LhsPacket>(&lhs2[alignedStart-2]);
              A03 = pload<LhsPacket>(&lhs3[alignedStart-3]);

              for (; j<peeledSize; j+=peels*RhsPacketSize)
              {
                RhsPacket b = pload<RhsPacket>(&rhs[j]);
                A11 = pload<LhsPacket>(&lhs1[j-1+LhsPacketSize]);  palign<1>(A01,A11);
                A12 = pload<LhsPacket>(&lhs2[j-2+LhsPacketSize]);  palign<2>(A02,A12);
                A13 = pload<LhsPacket>(&lhs3[j-3+LhsPacketSize]);  palign<3>(A03,A13);

                ptmp0 = pcj.pmadd(pload<LhsPacket>(&lhs0[j]), b, ptmp0);
                ptmp1 = pcj.pmadd(A01, b, ptmp1);
                A01 = pload<LhsPacket>(&lhs1[j-1+2*LhsPacketSize]);  palign<1>(A11,A01);
                ptmp2 = pcj.pmadd(A02, b, ptmp2);
                A02 = pload<LhsPacket>(&lhs2[j-2+2*LhsPacketSize]);  palign<2>(A12,A02);
                ptmp3 = pcj.pmadd(A03, b, ptmp3);
                A03 = pload<LhsPacket>(&lhs3[j-3+2*LhsPacketSize]);  palign<3>(A13,A03);

                b = pload<RhsPacket>(&rhs[j+RhsPacketSize]);
                ptmp0 = pcj.pmadd(pload<LhsPacket>(&lhs0[j+LhsPacketSize]), b, ptmp0);
                ptmp1 = pcj.pmadd(A11, b, ptmp1);
                ptmp2 = pcj.pmadd(A12, b, ptmp2);
                ptmp3 = pcj.pmadd(A13, b, ptmp3);
              }
            }
            for (; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,du);
            break;
          }
          default:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(du,du,du);
            break;
        }
        tmp0 += predux(ptmp0);
        tmp1 += predux(ptmp1);
        tmp2 += predux(ptmp2);
        tmp3 += predux(ptmp3);
      }
    } // end explicit vectorization

    // process remaining coeffs (or all if no explicit vectorization)
    // FIXME this loop get vectorized by the compiler !
    for (Index j=alignedSize; j<depth; ++j)
    {
      RhsScalar b = rhs[j];
      tmp0 += cj.pmul(lhs0[j],b); tmp1 += cj.pmul(lhs1[j],b);
      tmp2 += cj.pmul(lhs2[j],b); tmp3 += cj.pmul(lhs3[j],b);
    }
    res[i*resIncr]            += alpha*tmp0;
    res[(i+offset1)*resIncr]  += alpha*tmp1;
    res[(i+2)*resIncr]        += alpha*tmp2;
    res[(i+offset3)*resIncr]  += alpha*tmp3;
  }

  // process remaining first and last rows (at most columnsAtOnce-1)
  Index end = rows;
  Index start = rowBound;
  do
  {
    for (Index i=start; i<end; ++i)
    {
      EIGEN_ALIGN16 ResScalar tmp0 = ResScalar(0);
      ResPacket ptmp0 = pset1<ResPacket>(tmp0);
      const LhsScalar* lhs0 = lhs + i*lhsStride;
      // process first unaligned result's coeffs
      // FIXME this loop get vectorized by the compiler !
      for (Index j=0; j<alignedStart; ++j)
        tmp0 += cj.pmul(lhs0[j], rhs[j]);

      if (alignedSize>alignedStart)
      {
        // process aligned rhs coeffs
        if ((size_t(lhs0+alignedStart)%sizeof(LhsPacket))==0)
          for (Index j = alignedStart;j<alignedSize;j+=RhsPacketSize)
            ptmp0 = pcj.pmadd(pload<LhsPacket>(&lhs0[j]), pload<RhsPacket>(&rhs[j]), ptmp0);
        else
          for (Index j = alignedStart;j<alignedSize;j+=RhsPacketSize)
            ptmp0 = pcj.pmadd(ploadu<LhsPacket>(&lhs0[j]), pload<RhsPacket>(&rhs[j]), ptmp0);
        tmp0 += predux(ptmp0);
      }

      // process remaining scalars
      // FIXME this loop get vectorized by the compiler !
      for (Index j=alignedSize; j<depth; ++j)
        tmp0 += cj.pmul(lhs0[j], rhs[j]);
      res[i*resIncr] += alpha*tmp0;
    }
    if (skipRows)
    {
      start = 0;
      end = skipRows;
      skipRows = 0;
    }
    else
      break;
  } while(Vectorizable);

  #undef _EIGEN_ACCUMULATE_PACKETS
}